

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solver.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
lu::solve(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         *A,vector<double,_std::allocator<double>_> *b)

{
  int *piVar1;
  size_t __size;
  undefined4 uVar2;
  pointer pvVar3;
  pointer pvVar4;
  pointer pdVar5;
  pointer pdVar6;
  undefined8 uVar7;
  iterator __position;
  bool bVar8;
  long lVar9;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  double *__ptr_02;
  void *pvVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double *pdVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  size_t j;
  long lVar18;
  long lVar19;
  ulong uVar20;
  uint uVar21;
  size_type __n;
  double dVar22;
  double dVar23;
  
  pvVar3 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (A->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pvVar4 - (long)pvVar3 >> 3;
  __n = lVar9 * -0x5555555555555555;
  __size = lVar9 * 0x5555555555555558;
  __ptr = malloc(__size);
  __ptr_00 = malloc(__size);
  __ptr_01 = malloc(lVar9 * -0x5555555555555554 + 4);
  __ptr_02 = (double *)malloc(__size);
  if (pvVar4 != pvVar3) {
    lVar9 = 0;
    do {
      pvVar10 = malloc(__size);
      *(void **)((long)__ptr + lVar9 * 8) = pvVar10;
      lVar9 = lVar9 + 1;
    } while (__n + (__n == 0) != lVar9);
  }
  if (pvVar4 != pvVar3) {
    pdVar5 = (b->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar9 = __n + (__n == 0);
    lVar13 = 0;
    do {
      pdVar6 = pvVar3[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar19 = *(long *)((long)__ptr + lVar13 * 8);
      lVar18 = 0;
      do {
        *(double *)(lVar19 + lVar18 * 8) = pdVar6[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar9 != lVar18);
      *(double *)((long)__ptr_00 + lVar13 * 8) = pdVar5[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar9);
  }
  uVar21 = (uint)__n;
  if (-1 < (int)uVar21) {
    uVar11 = 0;
    do {
      *(int *)((long)__ptr_01 + uVar11 * 4) = (int)uVar11;
      uVar11 = uVar11 + 1;
    } while (uVar21 + 1 != uVar11);
  }
  if (0 < (int)uVar21) {
    uVar16 = (ulong)(uVar21 & 0x7fffffff);
    uVar12 = 1;
    uVar11 = 0;
    do {
      uVar15 = uVar11;
      uVar17 = uVar11;
      dVar22 = 0.0;
      do {
        dVar23 = ABS(*(double *)(*(long *)((long)__ptr + uVar17 * 8) + uVar11 * 8));
        uVar20 = uVar15;
        if (dVar22 < dVar23) {
          uVar20 = uVar17;
        }
        uVar15 = uVar20 & 0xffffffff;
        if (dVar23 <= dVar22) {
          dVar23 = dVar22;
        }
        uVar17 = uVar17 + 1;
        dVar22 = dVar23;
      } while (uVar16 != uVar17);
      if (dVar23 < 0.0) break;
      if (uVar11 != (uVar20 & 0xffffffff)) {
        uVar2 = *(undefined4 *)((long)__ptr_01 + uVar11 * 4);
        lVar9 = (long)(int)uVar20;
        *(undefined4 *)((long)__ptr_01 + uVar11 * 4) = *(undefined4 *)((long)__ptr_01 + lVar9 * 4);
        *(undefined4 *)((long)__ptr_01 + lVar9 * 4) = uVar2;
        uVar7 = *(undefined8 *)((long)__ptr + uVar11 * 8);
        *(undefined8 *)((long)__ptr + uVar11 * 8) = *(undefined8 *)((long)__ptr + lVar9 * 8);
        *(undefined8 *)((long)__ptr + lVar9 * 8) = uVar7;
        piVar1 = (int *)((long)__ptr_01 + uVar16 * 4);
        *piVar1 = *piVar1 + 1;
      }
      uVar15 = uVar11 + 1;
      if (uVar15 < uVar16) {
        lVar9 = *(long *)((long)__ptr + uVar11 * 8);
        uVar17 = uVar12;
        do {
          lVar13 = *(long *)((long)__ptr + uVar17 * 8);
          *(double *)(lVar13 + uVar11 * 8) =
               *(double *)(lVar13 + uVar11 * 8) / *(double *)(lVar9 + uVar11 * 8);
          uVar20 = uVar12;
          do {
            *(double *)(lVar13 + uVar20 * 8) =
                 *(double *)(lVar13 + uVar20 * 8) -
                 *(double *)(lVar13 + uVar11 * 8) * *(double *)(lVar9 + uVar20 * 8);
            uVar20 = uVar20 + 1;
          } while (uVar16 != uVar20);
          uVar17 = uVar17 + 1;
        } while (uVar17 != uVar16);
      }
      uVar12 = uVar12 + 1;
      uVar11 = uVar15;
    } while (uVar15 != uVar16);
    if (0 < (int)uVar21) {
      uVar11 = 0;
      do {
        dVar22 = *(double *)((long)__ptr_00 + (long)*(int *)((long)__ptr_01 + uVar11 * 4) * 8);
        __ptr_02[uVar11] = dVar22;
        if (uVar11 != 0) {
          lVar9 = *(long *)((long)__ptr + uVar11 * 8);
          uVar16 = 0;
          do {
            dVar22 = dVar22 - *(double *)(lVar9 + uVar16 * 8) * __ptr_02[uVar16];
            __ptr_02[uVar11] = dVar22;
            uVar16 = uVar16 + 1;
          } while (uVar11 != uVar16);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != (uVar21 & 0x7fffffff));
      if (0 < (int)uVar21) {
        uVar16 = (ulong)(uVar21 & 0x7fffffff);
        lVar9 = uVar16 * 8;
        pdVar14 = __ptr_02 + uVar16;
        uVar11 = uVar16;
        do {
          uVar12 = uVar11 - 1;
          if ((long)uVar11 < (long)uVar16) {
            dVar22 = __ptr_02[uVar12];
            lVar13 = *(long *)((long)__ptr + uVar12 * 8);
            lVar19 = 0;
            do {
              dVar22 = dVar22 - *(double *)(lVar13 + lVar9 + lVar19 * 8) * pdVar14[lVar19];
              __ptr_02[uVar12] = dVar22;
              lVar19 = lVar19 + 1;
            } while ((int)uVar11 + (int)lVar19 < (int)uVar21);
          }
          __ptr_02[uVar12] =
               __ptr_02[uVar12] / *(double *)(*(long *)((long)__ptr + uVar12 * 8) + uVar12 * 8);
          pdVar14 = pdVar14 + -1;
          lVar9 = lVar9 + -8;
          bVar8 = 1 < (long)uVar11;
          uVar11 = uVar12;
        } while (bVar8);
      }
    }
  }
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::reserve(__return_storage_ptr__,__n);
  if (pvVar4 != pvVar3) {
    lVar9 = 0;
    pdVar14 = __ptr_02;
    do {
      free(*(void **)((long)__ptr + lVar9 * 8));
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                   pdVar14);
      }
      else {
        *__position._M_current = *pdVar14;
        (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      lVar9 = lVar9 + 1;
      pdVar14 = pdVar14 + 1;
    } while (__n + (__n == 0) != lVar9);
  }
  free(__ptr);
  free(__ptr_00);
  free(__ptr_01);
  free(__ptr_02);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> solve(const std::vector<std::vector<double>> &A, const std::vector<double> &b)
{
    size_t N = A.size();
    double **A_matr = static_cast<double **>(malloc(N * sizeof(double *)));
    double *b_vec = static_cast<double *>(malloc(N * sizeof(double)));
    int *P = static_cast<int *>(malloc((N + 1) * sizeof(int)));
    double *res = static_cast<double *>(malloc(N * sizeof(double)));

    for (size_t i = 0; i < N; ++i)
    {
        A_matr[i] = static_cast<double *>(malloc(N * sizeof(double)));
    }
    for (size_t i = 0; i < N; ++i)
    {
        for (size_t j = 0; j < N; ++j)
        {
            A_matr[i][j] = A[i][j];
        }
        b_vec[i] = b[i];
    }
    LUPDecompose(A_matr, N, 0, P);
    LUPSolve(A_matr, P, b_vec, N, res);
    std::vector<double> x;
    x.reserve(N);
    for (size_t i = 0; i < N; ++i)
    {
        free(A_matr[i]);
        x.push_back(res[i]);
    }
    free(A_matr);
    free(b_vec);
    free(P);
    free(res);
    return x;
}